

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string msg;
  Names local_108;
  string local_48;
  
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    psVar4 = cmTarget::GetName_abi_cxx11_(this->Target);
    local_108.Base.field_2._8_8_ = (psVar4->_M_dataplus)._M_p;
    local_108.Base.field_2._M_allocated_capacity = psVar4->_M_string_length;
    local_108.Base._M_dataplus._M_p = (pointer)0x2d;
    local_108.Base._M_string_length = 0x79f511;
    views._M_len = 2;
    views._M_array = (iterator)&local_108;
    cmCatViews_abi_cxx11_(&local_48,views);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  TVar3 = cmTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    GetExecutableNames(&local_108,this,config);
  }
  else {
    GetLibraryNames(&local_108,this,config);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &local_108.Real.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Real._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_108.Real.field_2._M_allocated_capacity._1_7_,
                  local_108.Real.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108.Real.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_108.Real._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_108.Real.field_2._M_allocated_capacity._1_7_,
                  local_108.Real.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_108.Real._M_string_length;
  local_108.Real._M_string_length = 0;
  local_108.Real.field_2._M_local_buf[0] = '\0';
  local_108.Real._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.SharedObject._M_dataplus._M_p != &local_108.SharedObject.field_2) {
    operator_delete(local_108.SharedObject._M_dataplus._M_p,
                    local_108.SharedObject.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.PDB._M_dataplus._M_p != &local_108.PDB.field_2) {
    operator_delete(local_108.PDB._M_dataplus._M_p,local_108.PDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.ImportLibrary._M_dataplus._M_p != &local_108.ImportLibrary.field_2) {
    operator_delete(local_108.ImportLibrary._M_dataplus._M_p,
                    local_108.ImportLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Real._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.Real._M_dataplus._M_p,
                    CONCAT71(local_108.Real.field_2._M_allocated_capacity._1_7_,
                             local_108.Real.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Output._M_dataplus._M_p != &local_108.Output.field_2) {
    operator_delete(local_108.Output._M_dataplus._M_p,
                    local_108.Output.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Base._M_dataplus._M_p != &local_108.Base.field_2) {
    operator_delete(local_108.Base._M_dataplus._M_p,local_108.Base.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat("NormalGetRealName called on imported target: ",
                               this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    return this->GetExecutableNames(config).Real;
  }
  // Compute the real name that will be built.
  return this->GetLibraryNames(config).Real;
}